

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::LanguageScanRule
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang,string *config)

{
  string *name;
  char local_41;
  string local_40;
  
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_40,name);
  local_41 = '_';
  cmStrCat<std::__cxx11::string_const&,char_const(&)[8],std::__cxx11::string,char,std::__cxx11::string_const&>
            (__return_storage_ptr__,lang,(char (*) [8])0x74f0a6,&local_40,&local_41,config);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::LanguageScanRule(
  std::string const& lang, const std::string& config) const
{
  return cmStrCat(
    lang, "_SCAN__",
    cmGlobalNinjaGenerator::EncodeRuleName(this->GeneratorTarget->GetName()),
    '_', config);
}